

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryPipelineBarrierTests.cpp
# Opt level: O2

void __thiscall
vkt::memory::anon_unknown_0::MemoryTestInstance::resetResources(MemoryTestInstance *this)

{
  pointer ppCVar1;
  VkResult result;
  DeviceInterface *pDVar2;
  VkDevice pVVar3;
  pointer ppCVar4;
  size_t commandNdx;
  ulong uVar5;
  
  pDVar2 = Context::getDeviceInterface((this->super_TestInstance).m_context);
  pVVar3 = Context::getDevice((this->super_TestInstance).m_context);
  result = (*pDVar2->_vptr_DeviceInterface[4])(pDVar2,pVVar3);
  ::vk::checkResult(result,"vkd.deviceWaitIdle(device)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/memory/vktMemoryPipelineBarrierTests.cpp"
                    ,0x23a2);
  uVar5 = 0;
  while( true ) {
    ppCVar4 = (this->m_commands).
              super__Vector_base<vkt::memory::(anonymous_namespace)::Command_*,_std::allocator<vkt::memory::(anonymous_namespace)::Command_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    ppCVar1 = (this->m_commands).
              super__Vector_base<vkt::memory::(anonymous_namespace)::Command_*,_std::allocator<vkt::memory::(anonymous_namespace)::Command_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if ((ulong)((long)ppCVar1 - (long)ppCVar4 >> 3) <= uVar5) break;
    if (ppCVar4[uVar5] != (Command *)0x0) {
      (*ppCVar4[uVar5]->_vptr_Command[1])();
      ppCVar4 = (this->m_commands).
                super__Vector_base<vkt::memory::(anonymous_namespace)::Command_*,_std::allocator<vkt::memory::(anonymous_namespace)::Command_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
    }
    ppCVar4[uVar5] = (Command *)0x0;
    uVar5 = uVar5 + 1;
  }
  if (ppCVar1 != ppCVar4) {
    (this->m_commands).
    super__Vector_base<vkt::memory::(anonymous_namespace)::Command_*,_std::allocator<vkt::memory::(anonymous_namespace)::Command_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppCVar4;
  }
  de::details::
  UniqueBase<vkt::memory::(anonymous_namespace)::PrepareContext,_de::DefaultDeleter<vkt::memory::(anonymous_namespace)::PrepareContext>_>
  ::reset(&(this->m_prepareContext).
           super_UniqueBase<vkt::memory::(anonymous_namespace)::PrepareContext,_de::DefaultDeleter<vkt::memory::(anonymous_namespace)::PrepareContext>_>
         );
  de::details::
  UniqueBase<vkt::memory::(anonymous_namespace)::Memory,_de::DefaultDeleter<vkt::memory::(anonymous_namespace)::Memory>_>
  ::reset(&(this->m_memory).
           super_UniqueBase<vkt::memory::(anonymous_namespace)::Memory,_de::DefaultDeleter<vkt::memory::(anonymous_namespace)::Memory>_>
         );
  return;
}

Assistant:

void MemoryTestInstance::resetResources (void)
{
	const vk::DeviceInterface&	vkd		= m_context.getDeviceInterface();
	const vk::VkDevice			device	= m_context.getDevice();

	VK_CHECK(vkd.deviceWaitIdle(device));

	for (size_t commandNdx = 0; commandNdx < m_commands.size(); commandNdx++)
	{
		delete m_commands[commandNdx];
		m_commands[commandNdx] = DE_NULL;
	}

	m_commands.clear();
	m_prepareContext.clear();
	m_memory.clear();
}